

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Renderbuffers::StorageMultisampleTest::PrepareRenderbuffer
          (StorageMultisampleTest *this,RenderbufferInternalFormatConfiguration format,GLuint width,
          GLuint height,GLsizei samples)

{
  ostringstream *poVar1;
  GLuint *pGVar2;
  ostringstream *poVar3;
  ulong uVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  ulong uVar8;
  MessageBuilder *pMVar9;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  long lVar7;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  (**(code **)(lVar7 + 0x6d0))(2,this->m_fbo);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"glGenFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x2154);
  pGVar2 = this->m_rbo;
  (**(code **)(lVar7 + 0x3e0))(2,pGVar2);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"glCreateRenderbuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x2157);
  uVar4 = 0;
  do {
    uVar8 = uVar4;
    if (uVar8 == 2) goto LAB_00b08818;
    (**(code **)(lVar7 + 0x78))(0x8d40,this->m_fbo[uVar8]);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glBindFramebuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x215c);
    if (uVar8 == 0) {
      (**(code **)(lVar7 + 0xfb0))(*pGVar2,samples,format.internalformat,width,height);
      local_1c0.m_value = (**(code **)(lVar7 + 0x800))();
      if (local_1c0.m_value != 0) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar3 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::operator<<((ostream *)poVar3,
                        "Renderbuffer storage multisample test failed because NamedRenderbufferStorageMultisample generated "
                       );
        local_1c0.m_getName = glu::getErrorName;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar3);
        std::operator<<((ostream *)poVar3," error value. Renderbuffers format was ");
        pMVar9 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1b0,&format.internalformat_name);
        poVar1 = &pMVar9->m_str;
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", samples was "
                       );
        std::ostream::operator<<(poVar1,samples);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", width was ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", height was ")
        ;
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,".");
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00b08810;
      }
    }
    else {
      (**(code **)(lVar7 + 0xfb0))(pGVar2[uVar8],0,format.internalformat,width,height);
      iVar5 = (**(code **)(lVar7 + 0x800))();
      if (iVar5 != 0) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar3 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::operator<<((ostream *)poVar3,
                        "Renderbuffer storage multisample test failed because NamedRenderbufferStorageMultisample generated "
                       );
        local_1c0.m_getName = glu::getErrorName;
        local_1c0.m_value = iVar5;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar3);
        std::operator<<((ostream *)poVar3," error value. Renderbuffers format was ");
        pMVar9 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1b0,&format.internalformat_name);
        poVar1 = &pMVar9->m_str;
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", samples was "
                       );
        std::ostream::operator<<(poVar1,0);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", width was ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", height was ")
        ;
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,".");
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00b08810;
      }
    }
    if ((((format.hasRedComponent != false) || (format.hasGreenComponent != false)) ||
        (format.hasBlueComponent != false)) || (format.hasAlphaComponent == true)) {
      (**(code **)(lVar7 + 0xf10))(this->m_fbo[uVar8],0x8ce0,0x8d41,pGVar2[uVar8]);
    }
    if (format.hasDepthComponent == true) {
      (**(code **)(lVar7 + 0xf10))(this->m_fbo[uVar8],0x8d00,0x8d41,pGVar2[uVar8]);
    }
    if (format.hasStencilComponent == true) {
      (**(code **)(lVar7 + 0xf10))(this->m_fbo[uVar8],0x8d20,0x8d41,pGVar2[uVar8]);
    }
    local_1c0.m_value = (**(code **)(lVar7 + 0x170))(0x8d40);
    uVar4 = uVar8 + 1;
  } while (local_1c0.m_value == 0x8cd5);
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  poVar3 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::operator<<((ostream *)poVar3,"Renderbuffer storage multisample test failed due to ");
  local_1c0.m_getName = glu::getFramebufferStatusName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar3);
  std::operator<<((ostream *)poVar3," framebuffer status. Renderbuffers format was ");
  pMVar9 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&format.internalformat_name);
  poVar1 = &pMVar9->m_str;
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", samples was ");
  iVar5 = 0;
  if (uVar8 == 0) {
    iVar5 = samples;
  }
  std::ostream::operator<<(poVar1,iVar5);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", width was ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", height was ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,".");
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00b08810:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
LAB_00b08818:
  return 1 < uVar8;
}

Assistant:

bool StorageMultisampleTest::PrepareRenderbuffer(StorageMultisampleTest::RenderbufferInternalFormatConfiguration format,
												 glw::GLuint width, glw::GLuint height, glw::GLsizei samples)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genFramebuffers(2, m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

	gl.createRenderbuffers(2, m_rbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateRenderbuffers call failed.");

	for (glw::GLuint i = 0; i < 2; ++i)
	{
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

		if (i)
		{
			/* 2nd is not multisampled. */
			gl.namedRenderbufferStorageMultisample(m_rbo[i], 0, format.internalformat, width, height);

			if (glw::GLenum error = gl.getError())
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Renderbuffer storage multisample test failed because "
												"NamedRenderbufferStorageMultisample generated "
					<< glu::getErrorStr(error) << " error value. Renderbuffers format was "
					<< format.internalformat_name << ", samples was " << 0 << ", width was " << width << ", height was "
					<< height << "." << tcu::TestLog::EndMessage;
				return false;
			}
		}
		else
		{
			/* 1st is multisampled. */
			gl.namedRenderbufferStorageMultisample(m_rbo[i], samples, format.internalformat, width, height);

			if (glw::GLenum error = gl.getError())
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Renderbuffer storage multisample test failed because "
												"NamedRenderbufferStorageMultisample generated "
					<< glu::getErrorStr(error) << " error value. Renderbuffers format was "
					<< format.internalformat_name << ", samples was " << samples << ", width was " << width
					<< ", height was " << height << "." << tcu::TestLog::EndMessage;
				return false;
			}
		}

		if (format.hasRedComponent || format.hasGreenComponent || format.hasBlueComponent || format.hasAlphaComponent)
		{
			gl.namedFramebufferRenderbuffer(m_fbo[i], GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_rbo[i]);
		}

		if (format.hasDepthComponent)
		{
			gl.namedFramebufferRenderbuffer(m_fbo[i], GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, m_rbo[i]);
		}

		if (format.hasStencilComponent)
		{
			gl.namedFramebufferRenderbuffer(m_fbo[i], GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, m_rbo[i]);
		}

		glw::GLenum status = gl.checkFramebufferStatus(GL_FRAMEBUFFER);
		if (status != GL_FRAMEBUFFER_COMPLETE)
		{
			/* Log. */
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Renderbuffer storage multisample test failed due to "
				<< glu::getFramebufferStatusStr(status) << " framebuffer status. Renderbuffers format was "
				<< format.internalformat_name << ", samples was " << (i ? 0 : samples) << ", width was " << width
				<< ", height was " << height << "." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}